

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_html_cdata(MD_CTX *ctx,MD_LINE *lines,MD_SIZE n_lines,MD_OFFSET beg,MD_OFFSET max_end,
                    MD_OFFSET *p_end)

{
  uint in_ECX;
  long in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  MD_CHAR *in_R9;
  MD_OFFSET *unaff_retaddr;
  MD_OFFSET off;
  MD_LINE *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_ECX + 9 < *(uint *)(in_RSI + 4)) {
    iVar1 = memcmp((void *)(*in_RDI + (ulong)in_ECX),"<![CDATA[",9);
    if (iVar1 == 0) {
      iVar1 = md_scan_for_html_closer
                        ((MD_CTX *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_R9,in_ECX + 9,
                         in_stack_ffffffffffffffc0,(MD_SIZE)((ulong)((long)in_RDI + 0x204) >> 0x20),
                         (MD_OFFSET)((long)in_RDI + 0x204),(MD_OFFSET)in_RDI,
                         (MD_OFFSET *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         unaff_retaddr);
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
md_is_html_cdata(MD_CTX* ctx, const MD_LINE* lines, MD_SIZE n_lines, OFF beg, OFF max_end, OFF* p_end)
{
    static const CHAR open_str[] = _T("<![CDATA[");
    static const SZ open_size = SIZEOF_ARRAY(open_str) - 1;

    OFF off = beg;

    if(off + open_size >= lines[0].end)
        return FALSE;
    if(memcmp(STR(off), open_str, open_size) != 0)
        return FALSE;
    off += open_size;

    return md_scan_for_html_closer(ctx, _T("]]>"), 3,
                lines, n_lines, off, max_end, p_end, &ctx->html_cdata_horizon);
}